

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  ostream *this_00;
  Type TVar1;
  TestPartResultArray *this_01;
  pointer pcVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  int iVar4;
  TestPartResult *pTVar5;
  AssertionResult *pAVar6;
  int index;
  char *pcVar7;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  string expected;
  AssertionResult local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertionResult local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = this->results_;
  TVar1 = this->type_;
  pcVar7 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar7,pcVar7 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_68);
  _Var9._M_head_impl = local_68._M_head_impl;
  if ((int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249 == 1) {
    pTVar5 = TestPartResultArray::GetTestPartResult(this_01,0);
    if (pTVar5->type_ == TVar1) {
      pcVar7 = strstr((pTVar5->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar7 != (char *)0x0) {
        local_60.success_ = true;
        local_60.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        goto LAB_0013e6ae;
      }
      local_78.success_ = false;
      local_78.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar6 = AssertionResult::operator<<(&local_78,(char (*) [11])0x162ec0);
      pAVar6 = AssertionResult::operator<<(pAVar6,&local_50);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [14])" containing \"");
      pAVar6 = AssertionResult::operator<<(pAVar6,&this->substr_);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [3])0x163a2c);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
      AssertionResult::AssertionResult(&local_60,pAVar6);
    }
    else {
      local_78.success_ = false;
      local_78.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pAVar6 = AssertionResult::operator<<(&local_78,(char (*) [11])0x162ec0);
      pAVar6 = AssertionResult::operator<<(pAVar6,&local_50);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [2])0x163635);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
      AssertionResult::AssertionResult(&local_60,pAVar6);
    }
  }
  else {
    this_00 = (ostream *)(local_68._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)this_00,
               (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(_Var9._M_head_impl + 0x10),"\n",1);
        pTVar5 = TestPartResultArray::GetTestPartResult(this_01,index);
        _Var9._M_head_impl = local_68._M_head_impl;
        testing::operator<<((ostream *)(local_68._M_head_impl + 0x10),pTVar5);
        index = index + 1;
        iVar4 = (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 4);
      } while (SBORROW4(index,iVar4 * -0x49249249) != index + iVar4 * 0x49249249 < 0);
    }
    local_78.success_ = false;
    local_78.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pAVar6 = AssertionResult::operator<<(&local_78,(Message *)&local_68);
    AssertionResult::AssertionResult(&local_60,pAVar6);
  }
  uVar3._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_78.message_;
  if (local_78.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    pcVar2 = ((_Alloc_hider *)
             local_78.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl)->_M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)local_78.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(pcVar2);
    }
    operator_delete((void *)uVar3._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
LAB_0013e6ae:
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  _Var8._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60.message_;
  if (local_60.success_ != true) {
    Message::Message((Message *)&local_50);
    _Var8._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_60.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_60.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_60.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]cppjieba/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
               ,0x3d9,pcVar7);
    AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_50);
    AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (_Var8._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    pcVar2 = ((_Var8._M_head_impl)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(_Var8._M_head_impl)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(_Var8._M_head_impl);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->substr_).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}